

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcDsd.c
# Opt level: O1

void Lpk_FunCompareBoundSets
               (Lpk_Fun_t *p,Vec_Int_t *vBSets,int nCofDepth,uint uNonDecSupp,uint uLateArrSupp,
               Lpk_Res_t *pRes)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uSupp;
  int iVar5;
  long lVar6;
  
  pRes->nSuppSizeS = 0;
  pRes->nSuppSizeL = 0;
  pRes->DelayEst = 0;
  pRes->AreaEst = 0;
  pRes->nBSVars = 0;
  pRes->BSVars = 0;
  pRes->nCofVars = 0;
  pRes->pCofVars[0] = '\0';
  pRes->pCofVars[1] = '\0';
  pRes->pCofVars[2] = '\0';
  pRes->pCofVars[3] = '\0';
  pRes->Variable = 0;
  pRes->Polarity = 0;
  if (0 < vBSets->nSize) {
    lVar6 = 0;
    do {
      uVar3 = vBSets->pArray[lVar6];
      if ((((uVar3 & uLateArrSupp) == 0) && (uSupp = uVar3 & 0xffff, uSupp != 0)) &&
         ((uVar3 & uNonDecSupp) != 0)) {
        if ((uVar3 >> 0x10 & uVar3) != 0) {
          __assert_fail("(uBoundSet & (uBoundSet >> 16)) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkAbcDsd.c"
                        ,299,
                        "void Lpk_FunCompareBoundSets(Lpk_Fun_t *, Vec_Int_t *, int, unsigned int, unsigned int, Lpk_Res_t *)"
                       );
        }
        uVar3 = (uVar3 >> 1 & 0x5555) + (uVar3 & 0x5555);
        uVar3 = (uVar3 >> 2 & 0x3333) + (uVar3 & 0x3333);
        uVar3 = (uVar3 >> 4 & 0x707) + (uVar3 & 0x707);
        iVar4 = (uVar3 >> 8) + (uVar3 & 0xff);
        if (iVar4 != 1) {
          uVar3 = *(uint *)&p->field_0x8 >> 0xc & 0xf;
          if ((int)(uVar3 - nCofDepth) < iVar4) {
            __assert_fail("nVarsBS <= (int)p->nLutK - nCofDepth",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkAbcDsd.c"
                          ,0x12f,
                          "void Lpk_FunCompareBoundSets(Lpk_Fun_t *, Vec_Int_t *, int, unsigned int, unsigned int, Lpk_Res_t *)"
                         );
          }
          iVar5 = (*(uint *)&p->field_0x8 >> 7 & 0x1f) - iVar4;
          iVar2 = uVar3 - 1;
          iVar1 = iVar5 / iVar2;
          uVar3 = (uint)(0 < iVar5 % iVar2);
          iVar2 = Lpk_SuppDelay(uSupp,p->pDelays);
          if (((int)(iVar1 + uVar3) < (int)(*(uint *)&p->field_0x8 >> 0x10 & 0x1f)) &&
             (iVar2 < (int)(*(uint *)&p->field_0x8 >> 0x15 & 0x1ff))) {
            iVar5 = iVar5 + 1;
            if (((pRes->BSVars == 0) || (iVar5 < pRes->nSuppSizeL)) ||
               ((pRes->nSuppSizeL == iVar5 && (iVar2 + 1 < pRes->DelayEst)))) {
              pRes->nBSVars = iVar4;
              pRes->BSVars = uSupp;
              pRes->nSuppSizeS = iVar4 + nCofDepth;
              pRes->nSuppSizeL = iVar5;
              pRes->DelayEst = iVar2 + 1;
              pRes->AreaEst = iVar1 + uVar3 + 1;
            }
          }
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < vBSets->nSize);
  }
  if (pRes->BSVars != 0) {
    if ((int)(*(uint *)&p->field_0x8 >> 0x15 & 0x1ff) < pRes->DelayEst) {
      __assert_fail("pRes->DelayEst <= (int)p->nDelayLim",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkAbcDsd.c"
                    ,0x14f,
                    "void Lpk_FunCompareBoundSets(Lpk_Fun_t *, Vec_Int_t *, int, unsigned int, unsigned int, Lpk_Res_t *)"
                   );
    }
    if ((int)(*(uint *)&p->field_0x8 >> 0x10 & 0x1f) < pRes->AreaEst) {
      __assert_fail("pRes->AreaEst <= (int)p->nAreaLim",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkAbcDsd.c"
                    ,0x150,
                    "void Lpk_FunCompareBoundSets(Lpk_Fun_t *, Vec_Int_t *, int, unsigned int, unsigned int, Lpk_Res_t *)"
                   );
    }
  }
  return;
}

Assistant:

void Lpk_FunCompareBoundSets( Lpk_Fun_t * p, Vec_Int_t * vBSets, int nCofDepth, unsigned uNonDecSupp, unsigned uLateArrSupp, Lpk_Res_t * pRes )
{
    int fVerbose = 0;
    unsigned uBoundSet;
    int i, nVarsBS, nVarsRem, Delay, Area;

    // compare the resulting boundsets
    memset( pRes, 0, sizeof(Lpk_Res_t) );
    Vec_IntForEachEntry( vBSets, uBoundSet, i )
    {
        if ( (uBoundSet & 0xFFFF) == 0 ) // skip empty boundset
            continue;
        if ( (uBoundSet & uNonDecSupp) == 0 ) // skip those boundsets that are not in the domain of interest
            continue;
        if ( (uBoundSet & uLateArrSupp) ) // skip those boundsets that are late arriving
            continue;
if ( fVerbose )
{
Lpk_PrintSetOne( uBoundSet & 0xFFFF );
//printf( "\n" );
//Lpk_PrintSetOne( uBoundSet >> 16 );
//printf( "\n" );
}
        assert( (uBoundSet & (uBoundSet >> 16)) == 0 );
        nVarsBS = Kit_WordCountOnes( uBoundSet & 0xFFFF );
        if ( nVarsBS == 1 )
            continue;
        assert( nVarsBS <= (int)p->nLutK - nCofDepth );
        nVarsRem = p->nVars - nVarsBS + 1;
        Area = 1 + Lpk_LutNumLuts( nVarsRem, p->nLutK );
        Delay = 1 + Lpk_SuppDelay( uBoundSet & 0xFFFF, p->pDelays );
if ( fVerbose )
printf( "area = %d limit = %d  delay = %d limit = %d\n", Area, (int)p->nAreaLim, Delay, (int)p->nDelayLim );
        if ( Area > (int)p->nAreaLim || Delay > (int)p->nDelayLim )
            continue;
        if ( pRes->BSVars == 0 || pRes->nSuppSizeL > nVarsRem || (pRes->nSuppSizeL == nVarsRem && pRes->DelayEst > Delay) )
        {
            pRes->nBSVars = nVarsBS;
            pRes->BSVars = (uBoundSet & 0xFFFF);
            pRes->nSuppSizeS = nVarsBS + nCofDepth;
            pRes->nSuppSizeL = nVarsRem;
            pRes->DelayEst = Delay;
            pRes->AreaEst = Area;
        }
    }
if ( fVerbose )
{
if ( pRes->BSVars )
{
printf( "Found bound set " );
Lpk_PrintSetOne( pRes->BSVars );
printf( "\n" );
}
else
printf( "Did not find boundsets.\n" );
printf( "\n" );
}
    if ( pRes->BSVars )
    {
        assert( pRes->DelayEst <= (int)p->nDelayLim );
        assert( pRes->AreaEst <= (int)p->nAreaLim );
    }
}